

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Slice_x86::forward
          (Slice_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  int _elempack;
  uint uVar2;
  Mat *src;
  ulong _elemsize;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  void *pvVar9;
  size_t i_5;
  long lVar10;
  ulong uVar11;
  size_t i;
  ulong uVar12;
  void *pvVar13;
  pointer pMVar14;
  void *pvVar15;
  pointer pMVar16;
  int iVar17;
  int _elempack_00;
  undefined4 *puVar18;
  void *pvVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  size_t i_4;
  long lVar24;
  int *piVar25;
  int iVar26;
  size_t i_2;
  size_t i_1;
  bool bVar27;
  Mat local_88;
  int local_3c;
  long local_38;
  
  src = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_start;
  uVar1 = src->dims;
  _elemsize = src->elemsize;
  _elempack = src->elempack;
  uVar4 = (ulong)_elempack;
  lVar22 = *(long *)(&this->field_0xd0 + (long)this->_vptr_Slice_x86[-3]);
  iVar8 = *(int *)(&this->field_0x118 + (long)this->_vptr_Slice_x86[-3]);
  if (uVar1 == 1) {
    iVar23 = src->w;
    lVar10 = 0;
    lVar24 = 0;
    uVar12 = 0;
    iVar26 = 0;
    while( true ) {
      pMVar14 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar5 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pMVar14) / 0x48;
      if (uVar5 <= uVar12) break;
      uVar2 = *(uint *)(lVar22 + uVar12 * 4);
      uVar6 = (ulong)uVar2;
      if (uVar2 == 0xffffff17) {
        uVar6 = (ulong)(long)(iVar23 * _elempack - iVar26) / (uVar5 + lVar10);
      }
      bVar3 = (uVar6 & 3) == 0 & opt->use_packing_layout;
      iVar20 = (uint)bVar3 + (uint)bVar3 * 2 + 1;
      Mat::create((Mat *)((long)&pMVar14->data + lVar24),
                  (int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) /
                       (long)iVar20),_elemsize / uVar4 << bVar3 * '\x02',iVar20,opt->blob_allocator)
      ;
      pvVar13 = *(void **)((long)&pMVar14->data + lVar24);
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      if ((long)*(int *)((long)&pMVar14->c + lVar24) * *(long *)((long)&pMVar14->cstep + lVar24) ==
          0) {
        return -100;
      }
      memcpy(pvVar13,(void *)((long)iVar26 * 4 + (long)src->data),
             (long)*(int *)((long)&pMVar14->w + lVar24) *
             *(long *)((long)&pMVar14->elemsize + lVar24));
      iVar26 = (int)uVar6 + iVar26;
      uVar12 = uVar12 + 1;
      lVar24 = lVar24 + 0x48;
      lVar10 = lVar10 + -1;
    }
  }
  iVar8 = (iVar8 >> 0x1f & uVar1) + iVar8;
  if ((uVar1 == 2) && (iVar8 == 0)) {
    iVar23 = src->w;
    iVar26 = src->h;
    lVar24 = 0;
    lVar10 = 0;
    uVar12 = 0;
    iVar20 = 0;
    while( true ) {
      pMVar14 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar5 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pMVar14) / 0x48;
      if (uVar5 <= uVar12) break;
      uVar2 = *(uint *)(lVar22 + uVar12 * 4);
      uVar6 = (ulong)uVar2;
      if (uVar2 == 0xffffff17) {
        uVar6 = (ulong)(long)(iVar26 * _elempack - iVar20) / (uVar5 + lVar24);
      }
      bVar3 = (uVar6 & 3) == 0 & opt->use_packing_layout;
      iVar17 = (uint)bVar3 + (uint)bVar3 * 2 + 1;
      Mat::create((Mat *)((long)&pMVar14->data + lVar10),iVar23,
                  (int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) /
                       (long)iVar17),_elemsize / uVar4 << bVar3 * '\x02',iVar17,opt->blob_allocator)
      ;
      if (*(long *)((long)&pMVar14->data + lVar10) == 0) {
        return -100;
      }
      if ((long)*(int *)((long)&pMVar14->c + lVar10) * *(long *)((long)&pMVar14->cstep + lVar10) ==
          0) {
        return -100;
      }
      iVar20 = (int)uVar6 + iVar20;
      uVar12 = uVar12 + 1;
      lVar10 = lVar10 + 0x48;
      lVar24 = lVar24 + -1;
    }
    iVar26 = pMVar14->elempack;
    piVar25 = &pMVar14->elempack;
    while (bVar27 = uVar5 != 0, uVar5 = uVar5 - 1, bVar27) {
      if (*piVar25 < iVar26) {
        iVar26 = *piVar25;
      }
      piVar25 = piVar25 + 0x12;
    }
    local_88.data = src->data;
    local_88.refcount = src->refcount;
    local_88.elemsize = src->elemsize;
    local_88.elempack = src->elempack;
    local_88.allocator = src->allocator;
    local_88.dims = src->dims;
    local_88.w = src->w;
    local_88.h = src->h;
    local_88.d = src->d;
    local_88.c = src->c;
    local_88.cstep = src->cstep;
    if (local_88.refcount != (int *)0x0) {
      LOCK();
      *local_88.refcount = *local_88.refcount + 1;
      UNLOCK();
    }
    if (iVar26 < _elempack) {
      convert_packing(src,&local_88,iVar26,opt);
    }
    iVar20 = 0;
    if (0 < iVar23) {
      iVar20 = iVar23;
    }
    lVar10 = (long)(iVar23 * 4) * 4;
    local_38 = (long)iVar23 * 4;
    uVar12 = 0;
    pvVar13 = local_88.data;
    local_3c = iVar26;
    while( true ) {
      pMVar14 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar24 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pMVar14;
      if ((ulong)(lVar24 / 0x48) <= uVar12) break;
      pMVar16 = pMVar14 + uVar12;
      iVar17 = pMVar14[uVar12].elempack;
      if ((iVar26 == 1) && (iVar17 == 4)) {
        uVar5 = (ulong)(uint)pMVar16->h;
        if (pMVar16->h < 1) {
          uVar5 = 0;
        }
        pvVar9 = (void *)((long)(iVar23 * 3) * 4 + (long)pvVar13);
        pvVar15 = (void *)((long)(iVar23 * 2) * 4 + (long)pvVar13);
        lVar24 = local_38 + (long)pvVar13;
        for (uVar6 = 0; uVar6 != uVar5; uVar6 = uVar6 + 1) {
          puVar18 = (undefined4 *)
                    ((long)pMVar16->w * uVar6 * pMVar16->elemsize + (long)pMVar16->data);
          for (lVar21 = 0; iVar20 != (int)lVar21; lVar21 = lVar21 + 1) {
            *puVar18 = *(undefined4 *)((long)pvVar13 + lVar21 * 4);
            puVar18[1] = *(undefined4 *)(lVar24 + lVar21 * 4);
            puVar18[2] = *(undefined4 *)((long)pvVar15 + lVar21 * 4);
            puVar18[3] = *(undefined4 *)((long)pvVar9 + lVar21 * 4);
            puVar18 = puVar18 + 4;
          }
          pvVar13 = (void *)((long)pvVar13 + lVar10);
          pvVar9 = (void *)((long)pvVar9 + lVar10);
          pvVar15 = (void *)((long)pvVar15 + lVar10);
          lVar24 = lVar24 + lVar10;
        }
      }
      if (iVar26 == iVar17) {
        lVar24 = (long)pMVar16->h * (long)iVar23;
        memcpy(pMVar16->data,pvVar13,pMVar16->elemsize * lVar24);
        pvVar13 = (void *)((long)pvVar13 + (long)(int)lVar24 * (long)pMVar16->elempack * 4);
        iVar26 = local_3c;
      }
      uVar12 = uVar12 + 1;
    }
    if (local_88.refcount != (int *)0x0) {
      LOCK();
      *local_88.refcount = *local_88.refcount + -1;
      UNLOCK();
      if (*local_88.refcount == 0) {
        if (local_88.allocator == (Allocator *)0x0) {
          free(local_88.data);
        }
        else {
          (*(local_88.allocator)->_vptr_Allocator[3])
                    (local_88.allocator,local_88.data,lVar24 % 0x48);
        }
      }
    }
  }
  if ((uVar1 == 2) && (iVar8 == 1)) {
    iVar23 = src->w;
    uVar2 = src->h;
    uVar5 = (ulong)uVar2;
    lVar10 = 0;
    lVar24 = 0;
    uVar12 = 0;
    iVar26 = 0;
    while( true ) {
      pMVar14 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pMVar16 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      uVar6 = ((long)pMVar16 - (long)pMVar14) / 0x48;
      if (uVar6 <= uVar12) break;
      iVar20 = *(int *)(lVar22 + uVar12 * 4);
      if (iVar20 == -0xe9) {
        iVar20 = (int)((ulong)((long)iVar23 - (long)iVar26) / (uVar6 + lVar10));
      }
      Mat::create((Mat *)((long)&pMVar14->data + lVar24),iVar20,uVar2,_elemsize,_elempack,
                  opt->blob_allocator);
      if (*(long *)((long)&pMVar14->data + lVar24) == 0) {
        return -100;
      }
      if ((long)*(int *)((long)&pMVar14->c + lVar24) * *(long *)((long)&pMVar14->cstep + lVar24) ==
          0) {
        return -100;
      }
      iVar26 = iVar20 + iVar26;
      uVar12 = uVar12 + 1;
      lVar24 = lVar24 + 0x48;
      lVar10 = lVar10 + -1;
    }
    uVar12 = 0;
    if ((int)uVar2 < 1) {
      uVar5 = 0;
    }
    for (; uVar12 != uVar5; uVar12 = uVar12 + 1) {
      pvVar13 = (void *)((long)src->w * uVar12 * src->elemsize + (long)src->data);
      lVar10 = 0x2c;
      for (uVar6 = 0; uVar6 < (ulong)(((long)pMVar16 - (long)pMVar14) / 0x48); uVar6 = uVar6 + 1) {
        lVar24 = (long)*(int *)((long)&pMVar14->data + lVar10);
        memcpy((void *)(uVar12 * lVar24 * *(long *)((long)pMVar14 + lVar10 + -0x1c) +
                       *(long *)((long)pMVar14 + lVar10 + -0x2c)),pvVar13,lVar24 * _elemsize);
        pvVar13 = (void *)((long)pvVar13 + (long)*(int *)((long)&pMVar14->data + lVar10) * uVar4 * 4
                          );
        pMVar14 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pMVar16 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        lVar10 = lVar10 + 0x48;
      }
    }
  }
  if ((uVar1 == 3) && (iVar8 == 0)) {
    iVar23 = src->w;
    iVar26 = src->h;
    iVar20 = src->c;
    lVar10 = 0;
    lVar24 = 0;
    iVar17 = 0;
    uVar12 = 0;
    while( true ) {
      pMVar14 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar5 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pMVar14) / 0x48;
      if (uVar5 <= uVar12) break;
      uVar2 = *(uint *)(lVar22 + uVar12 * 4);
      uVar6 = (ulong)uVar2;
      if (uVar2 == 0xffffff17) {
        uVar6 = (ulong)(long)(iVar20 * _elempack - iVar17) / (uVar5 + lVar10);
      }
      bVar3 = (uVar6 & 3) == 0 & opt->use_packing_layout;
      _elempack_00 = (uint)bVar3 + (uint)bVar3 * 2 + 1;
      Mat::create((Mat *)((long)&pMVar14->data + lVar24),iVar23,iVar26,
                  (int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) /
                       (long)_elempack_00),_elemsize / uVar4 << bVar3 * '\x02',_elempack_00,
                  opt->blob_allocator);
      if (*(long *)((long)&pMVar14->data + lVar24) == 0) {
        return -100;
      }
      if ((long)*(int *)((long)&pMVar14->c + lVar24) * *(long *)((long)&pMVar14->cstep + lVar24) ==
          0) {
        return -100;
      }
      iVar17 = (int)uVar6 + iVar17;
      uVar12 = uVar12 + 1;
      lVar24 = lVar24 + 0x48;
      lVar10 = lVar10 + -1;
    }
    iVar23 = pMVar14->elempack;
    piVar25 = &pMVar14->elempack;
    while (bVar27 = uVar5 != 0, uVar5 = uVar5 - 1, bVar27) {
      if (*piVar25 < iVar23) {
        iVar23 = *piVar25;
      }
      piVar25 = piVar25 + 0x12;
    }
    local_88.data = src->data;
    local_88.refcount = src->refcount;
    local_88.elemsize = src->elemsize;
    local_88.elempack = src->elempack;
    local_88.allocator = src->allocator;
    local_88.dims = src->dims;
    local_88.w = src->w;
    local_88.h = src->h;
    local_88.d = src->d;
    local_88.c = src->c;
    local_88.cstep = src->cstep;
    if (local_88.refcount != (int *)0x0) {
      LOCK();
      *local_88.refcount = *local_88.refcount + 1;
      UNLOCK();
    }
    if (iVar23 < _elempack) {
      convert_packing(src,&local_88,iVar23,opt);
    }
    uVar5 = 0;
    uVar12 = 0;
    while( true ) {
      pMVar14 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar10 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pMVar14;
      if ((ulong)(lVar10 / 0x48) <= uVar12) break;
      pMVar16 = pMVar14 + uVar12;
      iVar26 = pMVar14[uVar12].elempack;
      if ((iVar23 == 1) && (iVar26 == 4)) {
        iVar26 = pMVar16->h * pMVar16->w;
        if (iVar26 < 1) {
          iVar26 = 0;
        }
        uVar5 = (ulong)(int)uVar5;
        uVar2 = pMVar16->c;
        if (pMVar16->c < 1) {
          uVar2 = 0;
        }
        lVar24 = local_88.cstep * local_88.elemsize;
        lVar10 = lVar24 * 4;
        pvVar19 = (void *)(lVar24 * uVar5 + (long)local_88.data);
        pvVar13 = (void *)((uVar5 + 1) * lVar24 + (long)local_88.data);
        pvVar9 = (void *)((uVar5 + 2) * lVar24 + (long)local_88.data);
        pvVar15 = (void *)((uVar5 + 3) * lVar24 + (long)local_88.data);
        for (uVar6 = 0; uVar6 != uVar2; uVar6 = uVar6 + 1) {
          puVar18 = (undefined4 *)(pMVar16->cstep * uVar6 * pMVar16->elemsize + (long)pMVar16->data)
          ;
          for (lVar24 = 0; iVar26 != (int)lVar24; lVar24 = lVar24 + 1) {
            *puVar18 = *(undefined4 *)((long)pvVar19 + lVar24 * 4);
            puVar18[1] = *(undefined4 *)((long)pvVar13 + lVar24 * 4);
            puVar18[2] = *(undefined4 *)((long)pvVar9 + lVar24 * 4);
            puVar18[3] = *(undefined4 *)((long)pvVar15 + lVar24 * 4);
            puVar18 = puVar18 + 4;
          }
          uVar5 = uVar5 + 4;
          pvVar19 = (void *)((long)pvVar19 + lVar10);
          pvVar13 = (void *)((long)pvVar13 + lVar10);
          pvVar9 = (void *)((long)pvVar9 + lVar10);
          pvVar15 = (void *)((long)pvVar15 + lVar10);
        }
        iVar26 = pMVar16->elempack;
      }
      if (iVar23 == iVar26) {
        memcpy(pMVar16->data,
               (void *)(local_88.cstep * (long)(int)uVar5 * local_88.elemsize + (long)local_88.data)
               ,(long)((int)pMVar16->cstep * pMVar16->c) * pMVar16->elemsize);
        uVar5 = (ulong)(uint)((int)uVar5 + pMVar16->c);
      }
      uVar12 = uVar12 + 1;
    }
    if (local_88.refcount != (int *)0x0) {
      LOCK();
      *local_88.refcount = *local_88.refcount + -1;
      UNLOCK();
      if (*local_88.refcount == 0) {
        if (local_88.allocator == (Allocator *)0x0) {
          free(local_88.data);
        }
        else {
          (*(local_88.allocator)->_vptr_Allocator[3])
                    (local_88.allocator,local_88.data,lVar10 % 0x48);
        }
      }
    }
  }
  if ((uVar1 == 3) && (iVar8 == 1)) {
    iVar23 = src->w;
    uVar2 = src->c;
    uVar12 = (ulong)uVar2;
    iVar26 = src->h;
    lVar10 = 0;
    lVar24 = 0;
    iVar20 = 0;
    uVar5 = 0;
    while( true ) {
      pMVar14 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pMVar16 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      uVar6 = ((long)pMVar16 - (long)pMVar14) / 0x48;
      if (uVar6 <= uVar5) break;
      iVar17 = *(int *)(lVar22 + uVar5 * 4);
      if (iVar17 == -0xe9) {
        iVar17 = (int)((ulong)((long)iVar26 - (long)iVar20) / (uVar6 + lVar10));
      }
      Mat::create((Mat *)((long)&pMVar14->data + lVar24),iVar23,iVar17,uVar2,_elemsize,_elempack,
                  opt->blob_allocator);
      if (*(long *)((long)&pMVar14->data + lVar24) == 0) {
        return -100;
      }
      if ((long)*(int *)((long)&pMVar14->c + lVar24) * *(long *)((long)&pMVar14->cstep + lVar24) ==
          0) {
        return -100;
      }
      iVar20 = iVar17 + iVar20;
      uVar5 = uVar5 + 1;
      lVar24 = lVar24 + 0x48;
      lVar10 = lVar10 + -1;
    }
    uVar5 = 0;
    if ((int)uVar2 < 1) {
      uVar12 = 0;
    }
    for (; uVar5 != uVar12; uVar5 = uVar5 + 1) {
      pvVar13 = (void *)(src->cstep * uVar5 * src->elemsize + (long)src->data);
      lVar10 = 0x40;
      for (uVar6 = 0; uVar6 < (ulong)(((long)pMVar16 - (long)pMVar14) / 0x48); uVar6 = uVar6 + 1) {
        lVar24 = (long)*(int *)((long)pMVar14 + lVar10 + -0x10) *
                 (long)*(int *)((long)pMVar14 + lVar10 + -0x14);
        memcpy((void *)(*(long *)((long)&pMVar14->data + lVar10) * uVar5 *
                        *(long *)((long)pMVar14 + lVar10 + -0x30) +
                       *(long *)((long)pMVar14 + lVar10 + -0x40)),pvVar13,lVar24 * _elemsize);
        pvVar13 = (void *)((long)pvVar13 + (long)((int)lVar24 * _elempack) * 4);
        pMVar14 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pMVar16 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        lVar10 = lVar10 + 0x48;
      }
    }
  }
  if ((uVar1 == 3) && (iVar8 == 2)) {
    iVar8 = src->w;
    uVar1 = src->h;
    uVar5 = (ulong)uVar1;
    uVar2 = src->c;
    uVar12 = (ulong)uVar2;
    lVar10 = 0;
    lVar24 = 0;
    iVar23 = 0;
    uVar6 = 0;
    while( true ) {
      pMVar14 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pMVar16 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      uVar7 = ((long)pMVar16 - (long)pMVar14) / 0x48;
      if (uVar7 <= uVar6) break;
      iVar26 = *(int *)(lVar22 + uVar6 * 4);
      if (iVar26 == -0xe9) {
        iVar26 = (int)((ulong)((long)iVar8 - (long)iVar23) / (uVar7 + lVar10));
      }
      Mat::create((Mat *)((long)&pMVar14->data + lVar24),iVar26,uVar1,uVar2,_elemsize,_elempack,
                  opt->blob_allocator);
      if ((*(long *)((long)&pMVar14->data + lVar24) == 0) ||
         ((long)*(int *)((long)&pMVar14->c + lVar24) * *(long *)((long)&pMVar14->cstep + lVar24) ==
          0)) {
        return -100;
      }
      iVar23 = iVar26 + iVar23;
      uVar6 = uVar6 + 1;
      lVar24 = lVar24 + 0x48;
      lVar10 = lVar10 + -1;
    }
    if ((int)uVar1 < 1) {
      uVar5 = 0;
    }
    if ((int)uVar2 < 1) {
      uVar12 = 0;
    }
    for (uVar6 = 0; uVar6 != uVar12; uVar6 = uVar6 + 1) {
      pvVar13 = (void *)(src->cstep * uVar6 * src->elemsize + (long)src->data);
      for (uVar7 = 0; uVar7 != uVar5; uVar7 = uVar7 + 1) {
        lVar22 = 0x40;
        for (uVar11 = 0; uVar11 < (ulong)(((long)pMVar16 - (long)pMVar14) / 0x48);
            uVar11 = uVar11 + 1) {
          lVar24 = (long)*(int *)((long)pMVar14 + lVar22 + -0x14);
          lVar10 = *(long *)((long)pMVar14 + lVar22 + -0x30);
          memcpy((void *)(uVar7 * lVar24 * lVar10 +
                         *(long *)((long)&pMVar14->data + lVar22) * uVar6 * lVar10 +
                         *(long *)((long)pMVar14 + lVar22 + -0x40)),pvVar13,lVar24 * _elemsize);
          pvVar13 = (void *)((long)pvVar13 +
                            (long)*(int *)((long)pMVar14 + lVar22 + -0x14) * uVar4 * 4);
          pMVar14 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          pMVar16 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
          lVar22 = lVar22 + 0x48;
        }
      }
    }
  }
  return 0;
}

Assistant:

int Slice_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;
    const int* slices_ptr = slices;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        // slice vector
        int w = bottom_blob.w * elempack;
        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX512F__
                out_elempack = slice % 16 == 0 ? 16 : slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#elif __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const float* ptr = (const float*)bottom_blob + q;
            float* outptr = top_blob;
            memcpy(outptr, ptr, top_blob.w * top_blob.elemsize);

            q += slice;
        }
    }

    if (dims == 2 && positive_axis == 0)
    {
        // slice image height
        int w = bottom_blob.w;
        int h = bottom_blob.h * elempack;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (h - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX512F__
                out_elempack = slice % 16 == 0 ? 16 : slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#elif __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        size_t out_elemsize = top_blobs[0].elemsize;
        int out_elempack = top_blobs[0].elempack;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            out_elemsize = std::min(out_elemsize, top_blobs[i].elemsize);
            out_elempack = std::min(out_elempack, top_blobs[i].elempack);
        }

        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > out_elempack)
        {
            convert_packing(bottom_blob, bottom_blob_unpacked, out_elempack, opt);
        }

        const float* ptr = bottom_blob_unpacked;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            Mat& top_blob = top_blobs[i];

#if __SSE2__
#if __AVX__
#if __AVX512F__
            if (out_elempack == 8 && top_blob.elempack == 16)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w * 8;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r0[4];
                        outptr0[5] = r0[5];
                        outptr0[6] = r0[6];
                        outptr0[7] = r0[7];
                        outptr0[8] = r1[0];
                        outptr0[9] = r1[1];
                        outptr0[10] = r1[2];
                        outptr0[11] = r1[3];
                        outptr0[12] = r1[4];
                        outptr0[13] = r1[5];
                        outptr0[14] = r1[6];
                        outptr0[15] = r1[7];

                        r0 += 8;
                        r1 += 8;
                        outptr0 += 16;
                    }

                    ptr += w * 16;
                }
            }
            if (out_elempack == 4 && top_blob.elempack == 16)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w * 4;
                    const float* r2 = ptr + w * 8;
                    const float* r3 = ptr + w * 12;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];
                        outptr0[8] = r2[0];
                        outptr0[9] = r2[1];
                        outptr0[10] = r2[2];
                        outptr0[11] = r2[3];
                        outptr0[12] = r3[0];
                        outptr0[13] = r3[1];
                        outptr0[14] = r3[2];
                        outptr0[15] = r3[3];

                        r0 += 4;
                        r1 += 4;
                        r2 += 4;
                        r3 += 4;
                        outptr0 += 16;
                    }

                    ptr += w * 16;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 16)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w;
                    const float* r2 = ptr + w * 2;
                    const float* r3 = ptr + w * 3;
                    const float* r4 = ptr + w * 4;
                    const float* r5 = ptr + w * 5;
                    const float* r6 = ptr + w * 6;
                    const float* r7 = ptr + w * 7;
                    const float* r8 = ptr + w * 8;
                    const float* r9 = ptr + w * 9;
                    const float* ra = ptr + w * 10;
                    const float* rb = ptr + w * 11;
                    const float* rc = ptr + w * 12;
                    const float* rd = ptr + w * 13;
                    const float* re = ptr + w * 14;
                    const float* rf = ptr + w * 15;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;
                        outptr0[8] = *r8++;
                        outptr0[9] = *r9++;
                        outptr0[10] = *ra++;
                        outptr0[11] = *rb++;
                        outptr0[12] = *rc++;
                        outptr0[13] = *rd++;
                        outptr0[14] = *re++;
                        outptr0[15] = *rf++;

                        outptr0 += 16;
                    }

                    ptr += w * 16;
                }
            }
#endif // __AVX512F__
            if (out_elempack == 4 && top_blob.elempack == 8)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w * 4;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];

                        r0 += 4;
                        r1 += 4;
                        outptr0 += 8;
                    }

                    ptr += w * 8;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 8)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w;
                    const float* r2 = ptr + w * 2;
                    const float* r3 = ptr + w * 3;
                    const float* r4 = ptr + w * 4;
                    const float* r5 = ptr + w * 5;
                    const float* r6 = ptr + w * 6;
                    const float* r7 = ptr + w * 7;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;

                        outptr0 += 8;
                    }

                    ptr += w * 8;
                }
            }
#endif // __AVX__
            if (out_elempack == 1 && top_blob.elempack == 4)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w;
                    const float* r2 = ptr + w * 2;
                    const float* r3 = ptr + w * 3;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;

                        outptr0 += 4;
                    }

                    ptr += w * 4;
                }
            }
#endif // __SSE2__
            if (out_elempack == top_blob.elempack)
            {
                // 1-1 4-4 8-8
                int size = w * top_blob.h;

                float* outptr = top_blob;
                memcpy(outptr, ptr, size * top_blob.elemsize);

                ptr += size * top_blob.elempack;
            }
        }
    }

    if (dims == 2 && positive_axis == 1)
    {
        // slice image width
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int j = 0; j < h; j++)
        {
            const float* ptr = bottom_blob.row<const float>(j);
            for (size_t i = 0; i < top_blobs.size(); i++)
            {
                Mat& top_blob = top_blobs[i];

                float* outptr = top_blob.row(j);
                memcpy(outptr, ptr, top_blob.w * elemsize);

                ptr += top_blob.w * elempack;
            }
        }
    }

    if (dims == 3 && positive_axis == 0)
    {
        // slice dim channel
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c * elempack;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (channels - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX512F__
                out_elempack = slice % 16 == 0 ? 16 : slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#elif __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        size_t out_elemsize = top_blobs[0].elemsize;
        int out_elempack = top_blobs[0].elempack;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            out_elemsize = std::min(out_elemsize, top_blobs[i].elemsize);
            out_elempack = std::min(out_elempack, top_blobs[i].elempack);
        }

        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > out_elempack)
        {
            convert_packing(bottom_blob, bottom_blob_unpacked, out_elempack, opt);
        }

        int p = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            Mat& top_blob = top_blobs[i];

#if __SSE2__
#if __AVX__
#if __AVX512F__
            if (out_elempack == 8 && top_blob.elempack == 16)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r0[4];
                        outptr0[5] = r0[5];
                        outptr0[6] = r0[6];
                        outptr0[7] = r0[7];
                        outptr0[8] = r1[0];
                        outptr0[9] = r1[1];
                        outptr0[10] = r1[2];
                        outptr0[11] = r1[3];
                        outptr0[12] = r1[4];
                        outptr0[13] = r1[5];
                        outptr0[14] = r1[6];
                        outptr0[15] = r1[7];

                        r0 += 8;
                        r1 += 8;
                        outptr0 += 16;
                    }

                    p += 2;
                }
            }
            if (out_elempack == 4 && top_blob.elempack == 16)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];
                        outptr0[8] = r2[0];
                        outptr0[9] = r2[1];
                        outptr0[10] = r2[2];
                        outptr0[11] = r2[3];
                        outptr0[12] = r3[0];
                        outptr0[13] = r3[1];
                        outptr0[14] = r3[2];
                        outptr0[15] = r3[3];

                        r0 += 4;
                        r1 += 4;
                        r2 += 4;
                        r3 += 4;
                        outptr0 += 16;
                    }

                    p += 4;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 16)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);
                    const float* r4 = bottom_blob_unpacked.channel(p + 4);
                    const float* r5 = bottom_blob_unpacked.channel(p + 5);
                    const float* r6 = bottom_blob_unpacked.channel(p + 6);
                    const float* r7 = bottom_blob_unpacked.channel(p + 7);
                    const float* r8 = bottom_blob_unpacked.channel(p + 8);
                    const float* r9 = bottom_blob_unpacked.channel(p + 9);
                    const float* ra = bottom_blob_unpacked.channel(p + 10);
                    const float* rb = bottom_blob_unpacked.channel(p + 11);
                    const float* rc = bottom_blob_unpacked.channel(p + 12);
                    const float* rd = bottom_blob_unpacked.channel(p + 13);
                    const float* re = bottom_blob_unpacked.channel(p + 14);
                    const float* rf = bottom_blob_unpacked.channel(p + 15);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;
                        outptr0[8] = *r8++;
                        outptr0[9] = *r9++;
                        outptr0[10] = *ra++;
                        outptr0[11] = *rb++;
                        outptr0[12] = *rc++;
                        outptr0[13] = *rd++;
                        outptr0[14] = *re++;
                        outptr0[15] = *rf++;

                        outptr0 += 16;
                    }

                    p += 16;
                }
            }
#endif // __AVX512F__
            if (out_elempack == 4 && top_blob.elempack == 8)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];

                        r0 += 4;
                        r1 += 4;
                        outptr0 += 8;
                    }

                    p += 2;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 8)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);
                    const float* r4 = bottom_blob_unpacked.channel(p + 4);
                    const float* r5 = bottom_blob_unpacked.channel(p + 5);
                    const float* r6 = bottom_blob_unpacked.channel(p + 6);
                    const float* r7 = bottom_blob_unpacked.channel(p + 7);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;

                        outptr0 += 8;
                    }

                    p += 8;
                }
            }
#endif // __AVX__
            if (out_elempack == 1 && top_blob.elempack == 4)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;

                        outptr0 += 4;
                    }

                    p += 4;
                }
            }
#endif // __SSE2__
            if (out_elempack == top_blob.elempack)
            {
                // 1-1 4-4 8-8
                int size = top_blob.total();

                const float* ptr = bottom_blob_unpacked.channel(p);
                float* outptr = top_blob;
                memcpy(outptr, ptr, size * top_blob.elemsize);

                p += top_blob.c;
            }
        }
    }

    if (dims == 3 && positive_axis == 1)
    {
        // slice dim height
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (h - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < channels; p++)
        {
            const float* ptr = bottom_blob.channel(p);

            for (size_t i = 0; i < top_blobs.size(); i++)
            {
                Mat& top_blob = top_blobs[i];

                int size = top_blob.w * top_blob.h;

                float* outptr = top_blob.channel(p);
                memcpy(outptr, ptr, size * elemsize);

                ptr += size * elempack;
            }
        }
    }

    if (dims == 3 && positive_axis == 2)
    {
        // slice dim width
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < channels; p++)
        {
            const float* ptr = bottom_blob.channel(p);

            for (int j = 0; j < h; j++)
            {
                for (size_t i = 0; i < top_blobs.size(); i++)
                {
                    Mat& top_blob = top_blobs[i];

                    float* outptr = top_blob.channel(p).row(j);
                    memcpy(outptr, ptr, top_blob.w * elemsize);

                    ptr += top_blob.w * elempack;
                }
            }
        }
    }

    return 0;
}